

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

ssize_t __thiscall DomLayoutItem::read(DomLayoutItem *this,int __fd,void *__buf,size_t __nbytes)

{
  char cVar1;
  int iVar2;
  long lVar3;
  DomWidget *this_00;
  DomLayout *this_01;
  DomSpacer *this_02;
  int iVar4;
  char16_t *pcVar5;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  undefined4 in_register_00000034;
  long lVar6;
  long in_FS_OFFSET;
  QStringView QVar7;
  QStringView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  QStringView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QStringView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QStringView QVar19;
  QStringView QVar20;
  QStringView QVar21;
  QStringView QVar22;
  QStringView QVar23;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_98;
  QString local_80;
  QStringView local_68;
  QArrayDataPointer<QXmlStreamAttribute> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  if (local_50.size != 0) {
    lVar6 = 0;
    do {
      iVar2 = 0;
      local_68.m_data = *(storage_type_conflict **)(local_50.ptr + lVar6 + 8);
      local_68.m_size = *(qsizetype *)(local_50.ptr + lVar6 + 0x10);
      if ((local_68.m_size == 3) &&
         (QVar7.m_data = local_68.m_data, QVar7.m_size = 3, QVar16.m_data = L"row",
         QVar16.m_size = 3, cVar1 = QtPrivate::equalStrings(QVar7,QVar16), cVar1 != '\0')) {
        QVar8.m_data = *(storage_type_conflict **)(local_50.ptr + lVar6 + 0x50);
        QVar8.m_size = *(qsizetype *)(local_50.ptr + lVar6 + 0x58);
        lVar3 = QString::toIntegral_helper(QVar8,(bool *)0x0,10);
        iVar4 = (int)lVar3;
        if ((int)lVar3 != lVar3) {
          iVar4 = iVar2;
        }
        this->m_attr_row = iVar4;
        this->m_has_attr_row = true;
      }
      else if ((local_68.m_size == 6) &&
              (QVar9.m_data = local_68.m_data, QVar9.m_size = 6, QVar17.m_data = L"column",
              QVar17.m_size = 6, cVar1 = QtPrivate::equalStrings(QVar9,QVar17), cVar1 != '\0')) {
        QVar10.m_data = *(storage_type_conflict **)(local_50.ptr + lVar6 + 0x50);
        QVar10.m_size = *(qsizetype *)(local_50.ptr + lVar6 + 0x58);
        lVar3 = QString::toIntegral_helper(QVar10,(bool *)0x0,10);
        iVar4 = (int)lVar3;
        if ((int)lVar3 != lVar3) {
          iVar4 = iVar2;
        }
        this->m_attr_column = iVar4;
        this->m_has_attr_column = true;
      }
      else if ((local_68.m_size == 7) &&
              (QVar11.m_data = local_68.m_data, QVar11.m_size = 7, QVar18.m_data = L"rowspan",
              QVar18.m_size = 7, cVar1 = QtPrivate::equalStrings(QVar11,QVar18), cVar1 != '\0')) {
        QVar12.m_data = *(storage_type_conflict **)(local_50.ptr + lVar6 + 0x50);
        QVar12.m_size = *(qsizetype *)(local_50.ptr + lVar6 + 0x58);
        lVar3 = QString::toIntegral_helper(QVar12,(bool *)0x0,10);
        iVar4 = (int)lVar3;
        if ((int)lVar3 != lVar3) {
          iVar4 = iVar2;
        }
        this->m_attr_rowSpan = iVar4;
        this->m_has_attr_rowSpan = true;
      }
      else if ((local_68.m_size == 7) &&
              (QVar13.m_data = local_68.m_data, QVar13.m_size = 7, QVar19.m_data = L"colspan",
              QVar19.m_size = 7, cVar1 = QtPrivate::equalStrings(QVar13,QVar19), cVar1 != '\0')) {
        QVar14.m_data = *(storage_type_conflict **)(local_50.ptr + lVar6 + 0x50);
        QVar14.m_size = *(qsizetype *)(local_50.ptr + lVar6 + 0x58);
        lVar3 = QString::toIntegral_helper(QVar14,(bool *)0x0,10);
        iVar4 = (int)lVar3;
        if ((int)lVar3 != lVar3) {
          iVar4 = iVar2;
        }
        this->m_attr_colSpan = iVar4;
        this->m_has_attr_colSpan = true;
      }
      else {
        if ((local_68.m_size == 9) &&
           (QVar15.m_data = local_68.m_data, QVar15.m_size = 9, QVar20.m_data = L"alignment",
           QVar20.m_size = 9, cVar1 = QtPrivate::equalStrings(QVar15,QVar20), cVar1 != '\0')) {
          QString::QString(&local_80,*(QChar **)(local_50.ptr + lVar6 + 0x50),
                           *(longlong *)(local_50.ptr + lVar6 + 0x58));
          QString::operator=(&this->m_attr_alignment,&local_80);
          this->m_has_attr_alignment = true;
        }
        else {
          local_98.a.m_size = 0x15;
          local_98.a.m_data = "Unexpected attribute ";
          local_98.b = &local_68;
          QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                    (&local_80,&local_98);
          QXmlStreamReader::raiseError((QString *)CONCAT44(in_register_00000034,__fd));
        }
        if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      lVar6 = lVar6 + 0x68;
    } while (local_50.size * 0x68 - lVar6 != 0);
  }
  iVar2 = QXmlStreamReader::error();
  if (iVar2 == 0) {
    do {
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 == 4) {
        local_68.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_68.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
        local_68 = (QStringView)QXmlStreamReader::name();
        QVar21.m_data = L"widget";
        QVar21.m_size = 6;
        pcVar5 = L"widget";
        iVar2 = QtPrivate::compareStrings(local_68,QVar21,CaseInsensitive);
        if (iVar2 == 0) {
          this_00 = (DomWidget *)operator_new(0x160);
          memset(this_00,0,0x160);
          DomWidget::read(this_00,__fd,__buf_00,(size_t)pcVar5);
          clear(this);
          this->m_kind = Widget;
          this->m_widget = this_00;
        }
        else {
          QVar22.m_data = L"layout";
          QVar22.m_size = 6;
          pcVar5 = L"layout";
          iVar2 = QtPrivate::compareStrings(local_68,QVar22,CaseInsensitive);
          if (iVar2 == 0) {
            this_01 = (DomLayout *)operator_new(0x128);
            memset(this_01,0,0x128);
            DomLayout::read(this_01,__fd,__buf_01,(size_t)pcVar5);
            clear(this);
            this->m_kind = Layout;
            this->m_layout = this_01;
          }
          else {
            QVar23.m_data = L"spacer";
            QVar23.m_size = 6;
            pcVar5 = L"spacer";
            iVar2 = QtPrivate::compareStrings(local_68,QVar23,CaseInsensitive);
            if (iVar2 == 0) {
              this_02 = (DomSpacer *)operator_new(0x38);
              (this_02->m_attr_name).d.d = (Data *)0x0;
              (this_02->m_attr_name).d.ptr = (char16_t *)0x0;
              (this_02->m_attr_name).d.size = 0;
              this_02->m_has_attr_name = false;
              *(undefined3 *)&this_02->field_0x19 = 0;
              this_02->m_children = 0;
              (this_02->m_property).d.d = (Data *)0x0;
              (this_02->m_property).d.ptr = (DomProperty **)0x0;
              (this_02->m_property).d.size = 0;
              DomSpacer::read(this_02,__fd,__buf_02,(size_t)pcVar5);
              clear(this);
              this->m_kind = Spacer;
              this->m_spacer = this_02;
            }
            else {
              local_98.a.m_size = 0x13;
              local_98.a.m_data = "Unexpected element ";
              local_98.b = &local_68;
              QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                        (&local_80,&local_98);
              QXmlStreamReader::raiseError((QString *)CONCAT44(in_register_00000034,__fd));
              if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
                }
              }
            }
          }
        }
      }
      else if (iVar2 == 5) break;
      iVar2 = QXmlStreamReader::error();
    } while (iVar2 == 0);
  }
  QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomLayoutItem::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"row"_s) {
            setAttributeRow(attribute.value().toInt());
            continue;
        }
        if (name == u"column"_s) {
            setAttributeColumn(attribute.value().toInt());
            continue;
        }
        if (name == u"rowspan"_s) {
            setAttributeRowSpan(attribute.value().toInt());
            continue;
        }
        if (name == u"colspan"_s) {
            setAttributeColSpan(attribute.value().toInt());
            continue;
        }
        if (name == u"alignment"_s) {
            setAttributeAlignment(attribute.value().toString());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"widget"_s, Qt::CaseInsensitive)) {
                auto *v = new DomWidget();
                v->read(reader);
                setElementWidget(v);
                continue;
            }
            if (!tag.compare(u"layout"_s, Qt::CaseInsensitive)) {
                auto *v = new DomLayout();
                v->read(reader);
                setElementLayout(v);
                continue;
            }
            if (!tag.compare(u"spacer"_s, Qt::CaseInsensitive)) {
                auto *v = new DomSpacer();
                v->read(reader);
                setElementSpacer(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}